

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void ctemplate::EmitModifiedString
               (vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                *modifiers,char *in,size_t inlen,PerExpandData *data,ExpandEmitter *outbuf)

{
  char *pcVar1;
  ulong uVar2;
  TemplateModifier *pTVar3;
  bool bVar4;
  size_type sVar5;
  const_reference pvVar6;
  pointer pMVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  undefined1 local_108 [8];
  StringEmitter scratchbuf2;
  string output_of_this_modifier;
  __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
  local_d8;
  __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
  local_d0;
  __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
  local_c8;
  __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
  local_c0;
  const_iterator it;
  string local_b0 [32];
  undefined1 local_90 [8];
  StringEmitter scratchbuf;
  string local_70 [8];
  string value_string;
  string local_50 [8];
  string result;
  ExpandEmitter *outbuf_local;
  PerExpandData *data_local;
  size_t inlen_local;
  char *in_local;
  vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *modifiers_local
  ;
  
  std::__cxx11::string::string(local_50);
  std::__cxx11::string::string(local_70);
  sVar5 = std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
          size(modifiers);
  data_local = (PerExpandData *)inlen;
  inlen_local = (size_t)in;
  if (1 < sVar5) {
    std::__cxx11::string::reserve((ulong)local_50);
    StringEmitter::StringEmitter((StringEmitter *)local_90,(string *)local_50);
    pvVar6 = std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
             ::front(modifiers);
    pcVar1 = pvVar6->value;
    pvVar6 = std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
             ::front(modifiers);
    uVar2 = pvVar6->value_len;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar1,uVar2,(allocator *)((long)&it._M_current + 7));
    std::__cxx11::string::operator=(local_70,local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    pvVar6 = std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
             ::front(modifiers);
    pTVar3 = pvVar6->modifier_info->modifier;
    (**pTVar3->_vptr_TemplateModifier)(pTVar3,in,inlen,data,local_90,local_70);
    local_c8._M_current =
         (ModifierAndValue *)
         std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
         begin(modifiers);
    local_c0 = __gnu_cxx::
               __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
               ::operator+(&local_c8,1);
    while( true ) {
      local_d8._M_current =
           (ModifierAndValue *)
           std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
           end(modifiers);
      local_d0 = __gnu_cxx::
                 __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
                 ::operator-(&local_d8,1);
      bVar4 = __gnu_cxx::operator!=(&local_c0,&local_d0);
      if (!bVar4) break;
      std::__cxx11::string::string((string *)&scratchbuf2.outbuf_);
      std::__cxx11::string::size();
      std::__cxx11::string::size();
      std::__cxx11::string::reserve((ulong)&scratchbuf2.outbuf_);
      StringEmitter::StringEmitter((StringEmitter *)local_108,(string *)&scratchbuf2.outbuf_);
      pMVar7 = __gnu_cxx::
               __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
               ::operator->(&local_c0);
      pcVar1 = pMVar7->value;
      pMVar7 = __gnu_cxx::
               __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
               ::operator->(&local_c0);
      uVar2 = pMVar7->value_len;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,pcVar1,uVar2,&local_129);
      std::__cxx11::string::operator=(local_70,local_128);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      pMVar7 = __gnu_cxx::
               __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
               ::operator->(&local_c0);
      pTVar3 = pMVar7->modifier_info->modifier;
      uVar8 = std::__cxx11::string::c_str();
      uVar9 = std::__cxx11::string::size();
      (**pTVar3->_vptr_TemplateModifier)(pTVar3,uVar8,uVar9,data,local_108,local_70);
      std::__cxx11::string::swap(local_50);
      StringEmitter::~StringEmitter((StringEmitter *)local_108);
      std::__cxx11::string::~string((string *)&scratchbuf2.outbuf_);
      __gnu_cxx::
      __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
      ::operator++(&local_c0);
    }
    inlen_local = std::__cxx11::string::data();
    data_local = (PerExpandData *)std::__cxx11::string::size();
    StringEmitter::~StringEmitter((StringEmitter *)local_90);
  }
  bVar4 = std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
          empty(modifiers);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    __assert_fail("!modifiers.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                  ,0x36d,
                  "void ctemplate::EmitModifiedString(const vector<ModifierAndValue> &, const char *, size_t, const PerExpandData *, ExpandEmitter *)"
                 );
  }
  pvVar6 = std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
           back(modifiers);
  pcVar1 = pvVar6->value;
  pvVar6 = std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
           back(modifiers);
  uVar2 = pvVar6->value_len;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,pcVar1,uVar2,&local_151);
  std::__cxx11::string::operator=(local_70,local_150);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  pvVar6 = std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
           back(modifiers);
  pTVar3 = pvVar6->modifier_info->modifier;
  (**pTVar3->_vptr_TemplateModifier)(pTVar3,inlen_local,data_local,data,outbuf,local_70);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

static void EmitModifiedString(const vector<ModifierAndValue>& modifiers,
                               const char* in, size_t inlen,
                               const PerExpandData* data,
                               ExpandEmitter* outbuf) {
  string result;
  string value_string;
  if (modifiers.size() > 1) {
    // If there's more than one modifiers, we need to store the
    // intermediate results in a temp-buffer.  We use a string.
    // We'll assume that each modifier adds about 12% to the input
    // size.
    result.reserve((inlen + inlen/8) + 16);
    StringEmitter scratchbuf(&result);
    value_string = string(modifiers.front().value, modifiers.front().value_len);
    modifiers.front().modifier_info->modifier->Modify(in, inlen, data,
                                                      &scratchbuf,
                                                      value_string);
    // Only used when modifiers.size() > 2
    for (vector<ModifierAndValue>::const_iterator it = modifiers.begin() + 1;
         it != modifiers.end()-1;  ++it) {
      string output_of_this_modifier;
      output_of_this_modifier.reserve(result.size() + result.size()/8 + 16);
      StringEmitter scratchbuf2(&output_of_this_modifier);
      value_string = string(it->value, it->value_len);
      it->modifier_info->modifier->Modify(result.c_str(), result.size(), data,
                                          &scratchbuf2, value_string);
      result.swap(output_of_this_modifier);
    }
    in = result.data();
    inlen = result.size();
  }
  // For the last modifier, we can write directly into outbuf
  assert(!modifiers.empty());
  value_string = string(modifiers.back().value, modifiers.back().value_len);
  modifiers.back().modifier_info->modifier->Modify(in, inlen, data, outbuf,
                                                   value_string);
}